

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  int *piVar3;
  long in_RSI;
  long in_RDI;
  int in_x;
  int x;
  int in_y;
  int y;
  float *output_ptr;
  float *ptr_1;
  int q_1;
  float *ptr;
  Mat top_blob_c;
  int q;
  int ow;
  int oh;
  size_t elemsize;
  int c;
  int w;
  int h;
  Mat *in_stack_fffffffffffffe90;
  Mat *in_stack_fffffffffffffe98;
  Mat *in_stack_fffffffffffffea0;
  Mat *pMVar4;
  undefined8 in_stack_fffffffffffffea8;
  Mat *in_stack_fffffffffffffeb0;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int in_stack_ffffffffffffff14;
  Allocator *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  Mat *in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  int local_a0;
  int local_4c;
  uint local_48;
  uint local_44;
  int local_34;
  uint local_30;
  uint local_2c;
  int local_4;
  
  local_2c = *(uint *)(in_RSI + 0x28);
  local_30 = *(uint *)(in_RSI + 0x24);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_44 = *(uint *)(in_RDI + 0x8c);
  local_48 = *(uint *)(in_RDI + 0x88);
  if (*(int *)(in_RSI + 0x20) == 1) {
    local_2c = 1;
    local_30 = 1;
    local_34 = *(int *)(in_RSI + 0x24);
  }
  if ((local_44 == 0) || (local_48 == 0)) {
    local_44 = (uint)((float)(int)local_2c * *(float *)(in_RDI + 0x84));
    local_48 = (uint)((float)(int)local_30 * *(float *)(in_RDI + 0x80));
  }
  if ((local_44 == local_2c) && (local_48 == local_30)) {
    Mat::operator=(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    local_4 = 0;
  }
  else {
    Mat::create(in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                (size_t)in_stack_fffffffffffffe98,(Allocator *)in_stack_fffffffffffffe90);
    bVar1 = Mat::empty(in_stack_fffffffffffffe90);
    if (bVar1) {
      local_4 = -100;
    }
    else if (*(int *)(in_RSI + 0x20) == 1) {
      for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
        Mat::channel(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        Mat::fill(in_stack_fffffffffffffea0,(float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        Mat::~Mat((Mat *)0x153ea3);
      }
      local_4 = 0;
    }
    else if (*(int *)(in_RDI + 0x90) == 1) {
      for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
        pMVar4 = (Mat *)&stack0xffffffffffffff20;
        Mat::channel(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(pMVar4);
        Mat::~Mat((Mat *)0x153f5f);
        in_stack_fffffffffffffe90 = (Mat *)&stack0xfffffffffffffee0;
        Mat::channel(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        in_stack_fffffffffffffe98 = (Mat *)Mat::operator_cast_to_float_(in_stack_fffffffffffffe90);
        Mat::~Mat((Mat *)0x153fa5);
        pMVar4 = in_stack_fffffffffffffe98;
        for (local_124 = 0; local_124 < (int)local_44; local_124 = local_124 + 1) {
          local_12c = (int)((float)local_124 / *(float *)(in_RDI + 0x84));
          local_130 = local_2c - 1;
          piVar3 = std::min<int>(&local_12c,&local_130);
          local_128 = *piVar3;
          for (local_134 = 0; local_134 < (int)local_48; local_134 = local_134 + 1) {
            local_13c = (int)((float)local_134 / *(float *)(in_RDI + 0x80));
            local_140 = local_30 - 1;
            piVar3 = std::min<int>(&local_13c,&local_140);
            local_138 = *piVar3;
            *(float *)((long)&pMVar4->data + (long)(int)(local_48 * local_124 + local_134) * 4) =
                 pfVar2[(int)(local_128 * local_30 + local_138)];
          }
        }
      }
      local_4 = 0;
    }
    else if (*(int *)(in_RDI + 0x90) == 2) {
      resize_bilinear(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                      in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14)
      ;
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)*(uint *)(in_RDI + 0x90),
              (ulong)local_44,(ulong)local_48);
      local_4 = -0xe9;
    }
  }
  return local_4;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)//nearest
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        resize_bilinear(bottom_blob, top_blob, ow, oh);
        return 0;

    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}